

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

Define * find_define(Context_conflict1 *ctx,char *sym)

{
  IncludeState *pIVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  char *pcVar5;
  byte *pbVar6;
  byte bVar7;
  char *pcVar8;
  Define *pDVar9;
  
  bVar2 = *sym;
  if (bVar2 == 0) {
    bVar7 = 5;
  }
  else {
    pbVar6 = (byte *)(sym + 1);
    bVar7 = 5;
    do {
      bVar7 = bVar7 * '!' ^ bVar2;
      bVar2 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    } while (bVar2 != 0);
  }
  for (pDVar9 = ctx->define_hashtable[bVar7]; pDVar9 != (Define *)0x0; pDVar9 = pDVar9->next) {
    iVar3 = strcmp(pDVar9->identifier,sym);
    if (iVar3 == 0) {
      return pDVar9;
    }
  }
  if (bVar7 == 0x4b) {
    pDVar9 = ctx->line_macro;
    if (pDVar9 == (Define *)0x0) {
      return (Define *)0x0;
    }
    iVar3 = strcmp(sym,"__LINE__");
    if (iVar3 != 0) {
      return (Define *)0x0;
    }
    (*ctx->free)(pDVar9->definition,ctx->malloc_data);
    pIVar1 = ctx->include_stack;
    pcVar8 = (char *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pcVar8 != (char *)0x0) {
      uVar4 = snprintf(pcVar8,0x20,"%u",(ulong)pIVar1->line);
      if (0x1f < uVar4) {
        __assert_fail("len < bufsize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x1db,"const Define *find_define(Context *, const char *)");
      }
      pDVar9 = ctx->line_macro;
      pDVar9->definition = pcVar8;
      return pDVar9;
    }
  }
  else {
    if (bVar7 != 0x43) {
      return (Define *)0x0;
    }
    pDVar9 = ctx->file_macro;
    if (pDVar9 == (Define *)0x0) {
      return (Define *)0x0;
    }
    iVar3 = strcmp(sym,"__FILE__");
    if (iVar3 != 0) {
      return (Define *)0x0;
    }
    (*ctx->free)(pDVar9->definition,ctx->malloc_data);
    if (ctx->include_stack == (IncludeState *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ctx->include_stack->filename;
    }
    __n = strlen(pcVar8);
    pcVar5 = (char *)(*ctx->malloc)((int)__n + 2,ctx->malloc_data);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\"';
      memcpy(pcVar5 + 1,pcVar8,__n);
      pcVar5[__n + 1] = '\"';
      pDVar9 = ctx->file_macro;
      pDVar9->definition = pcVar5;
      return pDVar9;
    }
  }
  ctx->out_of_memory = 1;
  return (Define *)0x0;
}

Assistant:

static const Define *find_define(Context *ctx, const char *sym)
{
    const uint8 hash = hash_define(sym);
    Define *bucket = ctx->define_hashtable[hash];
    while (bucket)
    {
        if (strcmp(bucket->identifier, sym) == 0)
            return bucket;
        bucket = bucket->next;
    } // while

    const uint8 filestrhash = 67;
    assert(hash_define("__FILE__") == filestrhash);

    const uint8 linestrhash = 75;
    assert(hash_define("__LINE__") == linestrhash);

    if ( (hash == filestrhash) && (ctx->file_macro) && (strcmp(sym, "__FILE__") == 0) )
    {
        Free(ctx, (char *) ctx->file_macro->definition);
        const IncludeState *state = ctx->include_stack;
        const char *fname = state ? state->filename : "";
        const size_t len = strlen(fname) + 2;
        char *str = (char *) Malloc(ctx, len);
        if (!str)
            return NULL;
        str[0] = '\"';
        memcpy(str + 1, fname, len - 2);
        str[len - 1] = '\"';
        ctx->file_macro->definition = str;
        return ctx->file_macro;
    } // if

    else if ( (hash == linestrhash) && (ctx->line_macro) && (strcmp(sym, "__LINE__") == 0) )
    {
        Free(ctx, (char *) ctx->line_macro->definition);
        const IncludeState *state = ctx->include_stack;
        const size_t bufsize = 32;
        char *str = (char *) Malloc(ctx, bufsize);
        if (!str)
            return 0;

        const size_t len = snprintf(str, bufsize, "%u", state->line);
        assert(len < bufsize); (void) len;
        ctx->line_macro->definition = str;
        return ctx->line_macro;
    } // else

    return NULL;
}